

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::copyImageIter(CopyImageTest *this)

{
  int iVar1;
  ObjectWrapper *this_00;
  ObjectWrapper *this_01;
  State *pSVar2;
  pointer dstImageData;
  int iVar3;
  deUint32 dstName;
  deUint32 srcName;
  TestLog *this_02;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  size_type sVar5;
  MessageBuilder *pMVar6;
  IVec3 *dstPos;
  MessageBuilder local_210;
  reference local_90;
  Copy *copy;
  int copyNdx;
  undefined1 local_78 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  copies;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *dstImageLevels;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *srcImageLevels;
  ObjectWrapper *dstImage;
  ObjectWrapper *srcImage;
  Functions *gl;
  TestLog *log;
  CopyImageTest *this_local;
  
  this_02 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  this_00 = this->m_state->srcImage;
  this_01 = this->m_state->dstImage;
  pSVar2 = this->m_state;
  copies.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->m_state->dstImageLevels;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
            *)local_78);
  generateCopies((vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                  *)local_78,&this->m_srcImageInfo,&this->m_dstImageInfo);
  copy._0_4_ = 0;
  while( true ) {
    iVar1 = (int)copy;
    sVar5 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
            ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                    *)local_78);
    if ((int)sVar5 <= iVar1) break;
    local_90 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
               ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                             *)local_78,(long)(int)copy);
    tcu::TestLog::operator<<(&local_210,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_210,(char (*) [24])"Copying area with size ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_90->size);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [29])" from source image position ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_90->srcPos);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])" and mipmap level ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_90->srcLevel);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [32])" to destination image position ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_90->dstPos);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [19])" and mipmap level ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_90->dstLevel);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2b094bb);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [31])"Size in destination format is ")
    ;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_90->dstSize);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_210);
    dstName = glu::ObjectWrapper::operator*(this_01);
    dstImageData = copies.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar1 = local_90->dstLevel;
    dstPos = &local_90->dstPos;
    srcName = glu::ObjectWrapper::operator*(this_00);
    copyImage((Functions *)CONCAT44(extraout_var,iVar3),dstName,
              (vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *)dstImageData,&this->m_dstImageInfo,iVar1,dstPos,srcName,&pSVar2->srcImageLevels,
              &this->m_srcImageInfo,local_90->srcLevel,&local_90->srcPos,&local_90->size);
    copy._0_4_ = (int)copy + 1;
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
             *)local_78);
  return;
}

Assistant:

void CopyImageTest::copyImageIter (void)
{
	TestLog&						log				= m_testCtx.getLog();
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	glu::ObjectWrapper&				srcImage		= *m_state->srcImage;
	glu::ObjectWrapper&				dstImage		= *m_state->dstImage;

	vector<ArrayBuffer<deUint8> >&	srcImageLevels	= m_state->srcImageLevels;
	vector<ArrayBuffer<deUint8> >&	dstImageLevels	= m_state->dstImageLevels;
	vector<Copy>					copies;

	generateCopies(copies, m_srcImageInfo, m_dstImageInfo);

	for (int copyNdx = 0; copyNdx < (int)copies.size(); copyNdx++)
	{
		const Copy& copy = copies[copyNdx];

		log	<< TestLog::Message
			<< "Copying area with size " << copy.size
			<< " from source image position " << copy.srcPos << " and mipmap level " << copy.srcLevel
			<< " to destination image position " << copy.dstPos << " and mipmap level " << copy.dstLevel << ". "
			<< "Size in destination format is " << copy.dstSize
			<< TestLog::EndMessage;

		copyImage(gl, *dstImage, dstImageLevels, m_dstImageInfo, copy.dstLevel, copy.dstPos,
					  *srcImage, srcImageLevels, m_srcImageInfo, copy.srcLevel, copy.srcPos, copy.size);
	}
}